

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

SquareMatrix<2> __thiscall pbrt::SquareMatrix<2>::operator/(SquareMatrix<2> *this,Float s)

{
  Float (*paFVar1) [2];
  int i;
  long lVar2;
  int j;
  long lVar3;
  SquareMatrix<2> r;
  
  paFVar1 = (Float (*) [2])&r;
  r.m = *&this->m;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      (*(Float (*) [2])*paFVar1)[lVar3] = (*(Float (*) [2])*paFVar1)[lVar3] / s;
    }
    paFVar1 = paFVar1 + 1;
  }
  return (SquareMatrix<2>)r.m;
}

Assistant:

operator/(Float s) const {
        DCHECK_NE(s, 0);
        SquareMatrix r = *this;
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                r.m[i][j] /= s;
        return r;
    }